

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void EmitByteNoListing(int byte,bool preserveDeviceMemory)

{
  long lVar1;
  int iVar2;
  
  someByteEmitted = 1;
  if (pass == 3) {
    lVar1 = (long)WBLength;
    iVar2 = WBLength + 1;
    WBLength = iVar2;
    WriteBuffer[lVar1] = (byte)byte;
    if (iVar2 == 0x2000) {
      WriteDest();
    }
  }
  if (DeviceID == (char *)0x0) {
    CheckRamLimitExceeded();
  }
  else {
    CDevice::CheckPage(Device,CHECK_EMIT);
    if (MemoryPointer != (byte *)0x0) {
      if (pass == 3 && !preserveDeviceMemory) {
        *MemoryPointer = (byte)byte;
      }
      MemoryPointer = MemoryPointer + 1;
    }
  }
  CurAddress = CurAddress + 1;
  if (PseudoORG != DISP_NONE) {
    adrdisp = adrdisp + 1;
  }
  return;
}

Assistant:

static void EmitByteNoListing(int byte, bool preserveDeviceMemory = false) {
	someByteEmitted = true;
	if (LASTPASS == pass) {
		WriteBuffer[WBLength++] = (char)byte;
		if (DESTBUFLEN == WBLength) WriteDest();
	}
	// the page-checking in device mode must be done in all passes, the slot can have "wrap" option
	if (DeviceID) {
		Device->CheckPage(CDevice::CHECK_EMIT);
		if (MemoryPointer) {
			if (LASTPASS == pass && !preserveDeviceMemory) *MemoryPointer = (char)byte;
			++MemoryPointer;
		}
	} else {
		CheckRamLimitExceeded();
	}
	++CurAddress;
	if (DISP_NONE != PseudoORG) ++adrdisp;
}